

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

int32_t __thiscall icu_63::MessagePattern::skipDouble(MessagePattern *this,int32_t index)

{
  short sVar1;
  bool bVar2;
  uint uVar3;
  char16_t cVar4;
  char16_t *pcVar5;
  
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar3 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    uVar3 = (int)sVar1 >> 5;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar5 = (this->msg).fUnion.fFields.fArray;
  }
  else {
    pcVar5 = (char16_t *)((long)&(this->msg).fUnion + 2);
  }
  do {
    if ((int)uVar3 <= index) {
      return index;
    }
    cVar4 = L'\xffff';
    if ((uint)index < uVar3) {
      cVar4 = pcVar5[index];
    }
    if ((ushort)cVar4 < 0x30) {
      bVar2 = false;
      if (((ushort)cVar4 < 0x2f) &&
         (bVar2 = false, (0x680000000000U >> ((ulong)(ushort)cVar4 & 0x3f) & 1) != 0))
      goto LAB_0028b754;
    }
    else {
LAB_0028b754:
      if (((ushort)cVar4 < 0x3a) || (((cVar4 == L'E' || (cVar4 == L'∞')) || (cVar4 == L'e')))) {
        index = index + 1;
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
    if (!bVar2) {
      return index;
    }
  } while( true );
}

Assistant:

int32_t
MessagePattern::skipDouble(int32_t index) {
    int32_t msgLength=msg.length();
    while(index<msgLength) {
        UChar c=msg.charAt(index);
        // U+221E: Allow the infinity symbol, for ChoiceFormat patterns.
        if((c<0x30 && c!=u_plus && c!=u_minus && c!=u_dot) || (c>0x39 && c!=u_e && c!=u_E && c!=0x221e)) {
            break;
        }
        ++index;
    }
    return index;
}